

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

ssize_t __thiscall
QTextStreamPrivate::read(QTextStreamPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  QString *this_00;
  Data *pDVar1;
  bool bVar2;
  void *pvVar3;
  long position;
  undefined4 in_register_00000034;
  QTextStreamPrivate *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  this_01 = (QTextStreamPrivate *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->deviceClosedNotifier).super_QObject.d_ptr.d = (QObjectData *)0x0;
  this->device = (QIODevice *)0x0;
  (this->deviceClosedNotifier).super_QObject._vptr_QObject = (_func_int **)0x0;
  this_00 = this_01->string;
  if (this_00 == (QString *)0x0) {
    do {
      position = this_01->readBufferOffset;
      pvVar3 = (void *)((this_01->readBuffer).d.size - position);
      if ((long)__buf <= (long)pvVar3) goto LAB_002cb42f;
      bVar2 = fillReadBuffer(this_01,-1);
    } while (bVar2);
    position = this_01->readBufferOffset;
    pvVar3 = (void *)((this_01->readBuffer).d.size - position);
LAB_002cb42f:
    if ((long)pvVar3 < (long)__buf) {
      __buf = pvVar3;
    }
    this_01->lastTokenSize = (qsizetype)__buf;
    QString::mid((QString *)&local_48,&this_01->readBuffer,position,(qsizetype)__buf);
  }
  else {
    pvVar3 = (void *)((this_00->d).size - this_01->stringOffset);
    if ((long)__buf <= (long)pvVar3) {
      pvVar3 = __buf;
    }
    this_01->lastTokenSize = (qsizetype)pvVar3;
    QString::mid((QString *)&local_48,this_00,this_01->stringOffset,(qsizetype)pvVar3);
  }
  pDVar1 = local_48.d;
  local_48.d = (Data *)0x0;
  this->device = (QIODevice *)pDVar1;
  (this->deviceClosedNotifier).super_QObject._vptr_QObject = (_func_int **)local_48.ptr;
  local_48.ptr = (char16_t *)0x0;
  (this->deviceClosedNotifier).super_QObject.d_ptr.d = (QObjectData *)local_48.size;
  local_48.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  consumeLastToken(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (ssize_t)this;
}

Assistant:

QString QTextStreamPrivate::read(qsizetype maxlen)
{
    QString ret;
    if (string) {
        lastTokenSize = qMin(maxlen, string->size() - stringOffset);
        ret = string->mid(stringOffset, lastTokenSize);
    } else {
        while (readBuffer.size() - readBufferOffset < maxlen && fillReadBuffer()) {}
        lastTokenSize = qMin(maxlen, readBuffer.size() - readBufferOffset);
        ret = readBuffer.mid(readBufferOffset, lastTokenSize);
    }
    consumeLastToken();

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::read() maxlen = %d, token length = %d",
           int(maxlen), int(ret.length()));
#endif
    return ret;
}